

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O0

int Psr_ManReadArguments(Psr_Man_t *p)

{
  Psr_Ntk_t *pPVar1;
  int iVar2;
  int local_5c;
  Vec_Int_t *pVStack_58;
  int iName;
  Vec_Int_t *vSigsR [3];
  Vec_Int_t *vSigs [3];
  int iType;
  int iRange;
  Psr_Man_t *p_local;
  
  vSigs[2]._4_4_ = 0;
  vSigs[2]._0_4_ = -1;
  vSigs[0] = &p->pNtk->vOutputs;
  vSigs[1] = &p->pNtk->vInouts;
  pVStack_58 = &p->pNtk->vInputsR;
  vSigsR[0] = &p->pNtk->vOutputsR;
  vSigsR[1] = &p->pNtk->vInoutsR;
  iVar2 = Psr_ManIsChar(p,'(');
  if (iVar2 == 0) {
    __assert_fail("Psr_ManIsChar(p, \'(\')",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                  ,0x293,"int Psr_ManReadArguments(Psr_Man_t *)");
  }
  p->pCur = p->pCur + 1;
  iVar2 = Psr_ManUtilSkipSpaces(p);
  if (iVar2 == 0) {
    do {
      local_5c = Psr_ManReadName(p);
      if (local_5c == 0) {
        iVar2 = Psr_ManErrorSet(p,"Error number 31.",0);
        return iVar2;
      }
      iVar2 = Psr_ManUtilSkipSpaces(p);
      if (iVar2 != 0) {
        iVar2 = Psr_ManErrorSet(p,"Error number 32.",0);
        return iVar2;
      }
      if ((0 < local_5c) && (local_5c < 4)) {
        vSigs[2]._0_4_ = local_5c;
        iVar2 = Psr_ManIsChar(p,'[');
        if (iVar2 != 0) {
          vSigs[2]._4_4_ = Psr_ManReadRange(p);
          if (vSigs[2]._4_4_ == 0) {
            iVar2 = Psr_ManErrorSet(p,"Error number 33.",0);
            return iVar2;
          }
          iVar2 = Psr_ManUtilSkipSpaces(p);
          if (iVar2 != 0) {
            iVar2 = Psr_ManErrorSet(p,"Error number 34.",0);
            return iVar2;
          }
        }
        local_5c = Psr_ManReadName(p);
        if (local_5c == 0) {
          iVar2 = Psr_ManErrorSet(p,"Error number 35.",0);
          return iVar2;
        }
      }
      if (0 < (int)vSigs[2]) {
        Vec_IntPush(vSigs[(long)((int)vSigs[2] + -1) + -1],local_5c);
        Vec_IntPush(*(Vec_Int_t **)((long)&stack0xffffffffffffffa8 + (long)((int)vSigs[2] + -1) * 8)
                    ,vSigs[2]._4_4_);
        pPVar1 = p->pNtk;
        iVar2 = Abc_Var2Lit2(local_5c,(int)vSigs[2]);
        Vec_IntPush(&pPVar1->vOrder,iVar2);
      }
      iVar2 = Psr_ManIsChar(p,')');
      if (iVar2 != 0) {
        iVar2 = Psr_ManIsChar(p,')');
        if (iVar2 != 0) {
          return 1;
        }
        __assert_fail("Psr_ManIsChar(p, \')\')",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/bac/bacReadVer.c"
                      ,0x2b4,"int Psr_ManReadArguments(Psr_Man_t *)");
      }
      iVar2 = Psr_ManIsChar(p,',');
      if (iVar2 == 0) {
        iVar2 = Psr_ManErrorSet(p,"Expecting comma in the instance.",0);
        return iVar2;
      }
      p->pCur = p->pCur + 1;
      iVar2 = Psr_ManUtilSkipSpaces(p);
    } while (iVar2 == 0);
    p_local._4_4_ = Psr_ManErrorSet(p,"Error number 36.",0);
  }
  else {
    p_local._4_4_ = Psr_ManErrorSet(p,"Error number 30.",0);
  }
  return p_local._4_4_;
}

Assistant:

static inline int Psr_ManReadArguments( Psr_Man_t * p )
{
    int iRange = 0, iType = -1;
    Vec_Int_t * vSigs[3]  = { &p->pNtk->vInputs,  &p->pNtk->vOutputs,  &p->pNtk->vInouts  };
    Vec_Int_t * vSigsR[3] = { &p->pNtk->vInputsR, &p->pNtk->vOutputsR, &p->pNtk->vInoutsR };
    assert( Psr_ManIsChar(p, '(') );
    p->pCur++;
    if ( Psr_ManUtilSkipSpaces(p) )             return Psr_ManErrorSet(p, "Error number 30.", 0);
    while ( 1 )
    {
        int iName = Psr_ManReadName( p );
        if ( iName == 0 )                       return Psr_ManErrorSet(p, "Error number 31.", 0);
        if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 32.", 0);
        if ( iName >= PRS_VER_INPUT && iName <= PRS_VER_INOUT ) // declaration
        {
            iType = iName;
            if ( Psr_ManIsChar(p, '[') )
            {
                iRange = Psr_ManReadRange(p);
                if ( iRange == 0 )              return Psr_ManErrorSet(p, "Error number 33.", 0);
                if ( Psr_ManUtilSkipSpaces(p) ) return Psr_ManErrorSet(p, "Error number 34.", 0);
            }
            iName = Psr_ManReadName( p );
            if ( iName == 0 )                   return Psr_ManErrorSet(p, "Error number 35.", 0);
        }
        if ( iType > 0 )
        {
            Vec_IntPush( vSigs[iType - PRS_VER_INPUT], iName );
            Vec_IntPush( vSigsR[iType - PRS_VER_INPUT], iRange );
            Vec_IntPush( &p->pNtk->vOrder, Abc_Var2Lit2(iName, iType) );
        }
        if ( Psr_ManIsChar(p, ')') )
            break;
        if ( !Psr_ManIsChar(p, ',') )           return Psr_ManErrorSet(p, "Expecting comma in the instance.", 0);
        p->pCur++;
        if ( Psr_ManUtilSkipSpaces(p) )         return Psr_ManErrorSet(p, "Error number 36.", 0);
    }
    // check final
    assert( Psr_ManIsChar(p, ')') );
    return 1;
}